

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

boundaries __thiscall
duckdb_fmt::v6::internal::fp::assign_with_boundaries<double>(fp *this,double d)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  boundaries bVar9;
  
  uVar7 = (ulong)d & 0xfffffffffffff;
  this->f = uVar7;
  uVar2 = (ulong)d >> 0x34 & 0x7ff;
  if (uVar2 == 0) {
    this->e = -0x432;
    iVar6 = -0x432;
  }
  else {
    this->f = uVar7 | 0x10000000000000;
    iVar6 = (int)uVar2 + -0x433;
    bVar8 = uVar7 == 0;
    this->e = iVar6;
    uVar7 = uVar7 | 0x10000000000000;
    if (uVar2 != 1 && bVar8) {
      cVar5 = '4' - (char)uVar2;
      cVar4 = (char)uVar2 + -0x35;
      uVar2 = 0x20000000000001;
      lVar3 = 0x3fffffffffffff;
      goto LAB_0118ad79;
    }
  }
  cVar5 = (char)iVar6;
  cVar4 = cVar5 + -1;
  uVar2 = uVar7 * 2 + 1;
  lVar3 = uVar7 * 2 + -1;
  if ((uVar7 & 0x10000000000000) == 0) {
    lVar1 = 0x3f;
    if ((uVar2 & 0x1fffffffffffff) != 0) {
      for (; (uVar2 & 0x1fffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = uVar2 << (~(byte)lVar1 + 0x36 & 0x3f);
    cVar5 = (((byte)lVar1 ^ 0x3f) - cVar5) + -9;
  }
  else {
    cVar5 = '\x01' - cVar5;
  }
LAB_0118ad79:
  bVar9.lower = lVar3 << (cVar4 + cVar5 + 10U & 0x3f);
  bVar9.upper = uVar2 << 10;
  return bVar9;
}

Assistant:

boundaries assign_with_boundaries(Double d) {
    bool is_lower_closer = assign(d);
    fp lower =
        is_lower_closer ? fp((f << 2) - 1, e - 2) : fp((f << 1) - 1, e - 1);
    // 1 in normalize accounts for the exponent shift above.
    fp upper = normalize<1>(fp((f << 1) + 1, e - 1));
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }